

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx2::ConeCurveMiMBIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *line)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined8 uVar74;
  undefined8 uVar75;
  undefined1 auVar76 [32];
  uint uVar77;
  uint uVar78;
  uint uVar79;
  long lVar80;
  ulong uVar81;
  Scene *pSVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar104;
  float fVar105;
  float fVar112;
  float fVar114;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar113;
  float fVar115;
  float fVar117;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined4 uVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  float fVar157;
  float fVar159;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar141;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar158;
  undefined1 auVar148 [64];
  float fVar160;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  float fVar172;
  undefined1 auVar173 [28];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  float fVar201;
  undefined1 auVar202 [28];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar203 [32];
  float fVar211;
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  int local_614;
  RayQueryContext *local_610;
  Scene *local_608;
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5e0;
  float local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  uint local_59c;
  uint local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  RayHit *local_428;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 auStack_370 [16];
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined4 uStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  local_428 = ray;
  local_610 = context;
  pSVar82 = context->scene;
  local_1a0[0] = line->sharedGeomID;
  local_608 = pSVar82;
  pGVar14 = (pSVar82->geometries).items[local_1a0[0]].ptr;
  fVar3 = (pGVar14->time_range).lower;
  fVar3 = pGVar14->fnumTimeSegments *
          (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar3) /
          ((pGVar14->time_range).upper - fVar3));
  auVar83 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
  auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
  auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
  uVar77 = (line->v0).field_0.i[0];
  lVar15 = *(long *)&pGVar14[3].time_range.upper;
  lVar80 = (long)(int)auVar83._0_4_ * 0x38;
  lVar16 = *(long *)(lVar15 + lVar80);
  lVar17 = *(long *)(lVar15 + 0x10 + lVar80);
  uVar79 = (line->v0).field_0.i[1];
  uVar78 = (line->v0).field_0.i[2];
  uVar9 = (line->v0).field_0.i[4];
  auVar106._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar9);
  auVar106._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar77);
  uVar10 = (line->v0).field_0.i[5];
  puVar1 = (undefined8 *)(lVar16 + lVar17 * (ulong)uVar10);
  uStack_530 = *puVar1;
  _local_540 = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar79);
  uStack_528 = puVar1[1];
  uVar11 = (line->v0).field_0.i[6];
  auVar130._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar11);
  auVar130._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar78);
  uVar12 = (line->v0).field_0.i[3];
  uVar13 = (line->v0).field_0.i[7];
  auVar94._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar13);
  auVar94._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)uVar12);
  pauVar2 = (undefined1 (*) [12])(lVar16 + lVar17 * (ulong)(uVar79 + 1));
  puVar1 = (undefined8 *)(lVar16 + lVar17 * (ulong)(uVar9 + 1));
  local_500._16_8_ = *puVar1;
  local_500._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar77 + 1));
  local_500._24_8_ = puVar1[1];
  puVar1 = (undefined8 *)(lVar16 + lVar17 * (ulong)(uVar10 + 1));
  uVar74 = *puVar1;
  uVar75 = puVar1[1];
  fStack_554 = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
  uStack_550 = (undefined4)uVar74;
  uStack_54c = (undefined4)((ulong)uVar74 >> 0x20);
  uStack_548 = (undefined4)uVar75;
  fStack_544 = (float)((ulong)uVar75 >> 0x20);
  auVar161._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar11 + 1));
  auVar161._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar78 + 1));
  auVar174._16_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar13 + 1));
  auVar174._0_16_ = *(undefined1 (*) [16])(lVar16 + lVar17 * (ulong)(uVar12 + 1));
  lVar16 = *(long *)(lVar15 + 0x38 + lVar80);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar80);
  auVar182._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar9 * lVar15);
  auVar182._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar77 * lVar15);
  auVar187._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar10 * lVar15);
  auVar187._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar79 * lVar15);
  auVar191._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar11 * lVar15);
  auVar191._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar78 * lVar15);
  auVar197._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar13 * lVar15);
  auVar197._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar12 * lVar15);
  auVar203._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar9 + 1) * lVar15);
  auVar203._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar77 + 1) * lVar15);
  auVar122._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar11 + 1) * lVar15);
  auVar122._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar78 + 1) * lVar15);
  fVar3 = fVar3 - auVar83._0_4_;
  auVar100 = vunpcklps_avx(auVar106,auVar130);
  auVar102 = vunpckhps_avx(auVar106,auVar130);
  auVar169 = vunpcklps_avx(_local_540,auVar94);
  auVar146 = vunpckhps_avx(_local_540,auVar94);
  auVar139 = vunpcklps_avx(auVar100,auVar169);
  auVar100 = vunpckhps_avx(auVar100,auVar169);
  auVar30 = vunpcklps_avx(auVar102,auVar146);
  auVar102 = vunpckhps_avx(auVar102,auVar146);
  auVar94 = vunpcklps_avx(local_500,auVar161);
  auVar146 = vunpckhps_avx(local_500,auVar161);
  auVar76._12_4_ = fStack_554;
  auVar76._0_12_ = *pauVar2;
  auVar76._16_4_ = uStack_550;
  auVar76._20_4_ = uStack_54c;
  auVar76._24_4_ = uStack_548;
  auVar76._28_4_ = fStack_544;
  auVar192 = vunpcklps_avx(auVar76,auVar174);
  auVar169 = vunpckhps_avx(auVar76,auVar174);
  auVar108 = vunpcklps_avx(auVar94,auVar192);
  auVar94 = vunpckhps_avx(auVar94,auVar192);
  auVar31 = vunpcklps_avx(auVar146,auVar169);
  auVar146 = vunpckhps_avx(auVar146,auVar169);
  auVar199 = vunpcklps_avx(auVar182,auVar191);
  auVar169 = vunpckhps_avx(auVar182,auVar191);
  auVar32 = vunpcklps_avx(auVar187,auVar197);
  auVar192 = vunpckhps_avx(auVar187,auVar197);
  auVar133 = vunpcklps_avx(auVar199,auVar32);
  auVar199 = vunpckhps_avx(auVar199,auVar32);
  auVar33 = vunpcklps_avx(auVar169,auVar192);
  auVar169 = vunpckhps_avx(auVar169,auVar192);
  auVar132 = vunpcklps_avx(auVar203,auVar122);
  auVar192 = vunpckhps_avx(auVar203,auVar122);
  auVar123._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar10 + 1) * lVar15);
  auVar123._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar79 + 1) * lVar15);
  auVar83 = *(undefined1 (*) [16])(lVar16 + lVar15 * (ulong)(uVar13 + 1));
  auVar188._16_16_ = auVar83;
  auVar188._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar12 + 1) * lVar15);
  auVar34 = vunpcklps_avx(auVar123,auVar188);
  auVar101 = vunpckhps_avx(auVar123,auVar188);
  auVar35 = vunpcklps_avx(auVar132,auVar34);
  auVar132 = vunpckhps_avx(auVar132,auVar34);
  auVar34 = vunpcklps_avx(auVar192,auVar101);
  auVar192 = vunpckhps_avx(auVar192,auVar101);
  fVar29 = 1.0 - fVar3;
  auVar84._4_4_ = fVar29;
  auVar84._0_4_ = fVar29;
  auVar84._8_4_ = fVar29;
  auVar84._12_4_ = fVar29;
  auVar84._16_4_ = fVar29;
  auVar84._20_4_ = fVar29;
  auVar84._24_4_ = fVar29;
  auVar84._28_4_ = fVar29;
  auVar101._4_4_ = auVar133._4_4_ * fVar3;
  auVar101._0_4_ = auVar133._0_4_ * fVar3;
  auVar101._8_4_ = auVar133._8_4_ * fVar3;
  auVar101._12_4_ = auVar133._12_4_ * fVar3;
  auVar101._16_4_ = auVar133._16_4_ * fVar3;
  auVar101._20_4_ = auVar133._20_4_ * fVar3;
  auVar101._24_4_ = auVar133._24_4_ * fVar3;
  auVar101._28_4_ = auVar83._12_4_;
  auVar36 = vfmadd231ps_fma(auVar101,auVar84,auVar139);
  auVar139._4_4_ = auVar199._4_4_ * fVar3;
  auVar139._0_4_ = auVar199._0_4_ * fVar3;
  auVar139._8_4_ = auVar199._8_4_ * fVar3;
  auVar139._12_4_ = auVar199._12_4_ * fVar3;
  auVar139._16_4_ = auVar199._16_4_ * fVar3;
  auVar139._20_4_ = auVar199._20_4_ * fVar3;
  auVar139._24_4_ = auVar199._24_4_ * fVar3;
  auVar139._28_4_ = auVar32._28_4_;
  auVar37 = vfmadd231ps_fma(auVar139,auVar84,auVar100);
  auVar100._4_4_ = auVar33._4_4_ * fVar3;
  auVar100._0_4_ = auVar33._0_4_ * fVar3;
  auVar100._8_4_ = auVar33._8_4_ * fVar3;
  auVar100._12_4_ = auVar33._12_4_ * fVar3;
  auVar100._16_4_ = auVar33._16_4_ * fVar3;
  auVar100._20_4_ = auVar33._20_4_ * fVar3;
  auVar100._24_4_ = auVar33._24_4_ * fVar3;
  auVar100._28_4_ = auVar199._28_4_;
  auVar38 = vfmadd231ps_fma(auVar100,auVar84,auVar30);
  auVar142._8_4_ = 0x3f800000;
  auVar142._0_8_ = 0x3f8000003f800000;
  auVar142._12_4_ = 0x3f800000;
  auVar142._16_4_ = 0x3f800000;
  auVar142._20_4_ = 0x3f800000;
  auVar142._24_4_ = 0x3f800000;
  auVar142._28_4_ = 0x3f800000;
  auVar199._4_4_ = fVar3 * auVar169._4_4_;
  auVar199._0_4_ = fVar3 * auVar169._0_4_;
  auVar199._8_4_ = fVar3 * auVar169._8_4_;
  auVar199._12_4_ = fVar3 * auVar169._12_4_;
  auVar199._16_4_ = fVar3 * auVar169._16_4_;
  auVar199._20_4_ = fVar3 * auVar169._20_4_;
  auVar199._24_4_ = fVar3 * auVar169._24_4_;
  auVar199._28_4_ = auVar169._28_4_;
  auVar39 = vfmadd231ps_fma(auVar199,auVar84,auVar102);
  auVar169._4_4_ = fVar3 * auVar35._4_4_;
  auVar169._0_4_ = fVar3 * auVar35._0_4_;
  auVar169._8_4_ = fVar3 * auVar35._8_4_;
  auVar169._12_4_ = fVar3 * auVar35._12_4_;
  auVar169._16_4_ = fVar3 * auVar35._16_4_;
  auVar169._20_4_ = fVar3 * auVar35._20_4_;
  auVar169._24_4_ = fVar3 * auVar35._24_4_;
  auVar169._28_4_ = auVar33._28_4_;
  auVar137._0_4_ = auVar132._0_4_ * fVar3;
  auVar137._4_4_ = auVar132._4_4_ * fVar3;
  auVar137._8_4_ = auVar132._8_4_ * fVar3;
  auVar137._12_4_ = auVar132._12_4_ * fVar3;
  auVar137._16_4_ = auVar132._16_4_ * fVar3;
  auVar137._20_4_ = auVar132._20_4_ * fVar3;
  auVar137._24_4_ = auVar132._24_4_ * fVar3;
  auVar137._28_4_ = 0;
  auVar132._4_4_ = auVar34._4_4_ * fVar3;
  auVar132._0_4_ = auVar34._0_4_ * fVar3;
  auVar132._8_4_ = auVar34._8_4_ * fVar3;
  auVar132._12_4_ = auVar34._12_4_ * fVar3;
  auVar132._16_4_ = auVar34._16_4_ * fVar3;
  auVar132._20_4_ = auVar34._20_4_ * fVar3;
  auVar132._24_4_ = auVar34._24_4_ * fVar3;
  auVar132._28_4_ = auVar34._28_4_;
  auVar32._4_4_ = fVar3 * auVar192._4_4_;
  auVar32._0_4_ = fVar3 * auVar192._0_4_;
  auVar32._8_4_ = fVar3 * auVar192._8_4_;
  auVar32._12_4_ = fVar3 * auVar192._12_4_;
  auVar32._16_4_ = fVar3 * auVar192._16_4_;
  auVar32._20_4_ = fVar3 * auVar192._20_4_;
  auVar32._24_4_ = fVar3 * auVar192._24_4_;
  auVar32._28_4_ = auVar30._28_4_;
  auVar40 = vfmadd231ps_fma(auVar169,auVar84,auVar108);
  auVar41 = vfmadd231ps_fma(auVar137,auVar84,auVar94);
  auVar42 = vfmadd231ps_fma(auVar132,auVar84,auVar31);
  auVar43 = vfmadd231ps_fma(auVar32,auVar84,auVar146);
  uVar7 = line->leftExists;
  uVar8 = line->rightExists;
  auVar102 = vpcmpeqd_avx2(auVar192,auVar192);
  auVar94 = vpcmpeqd_avx2(auVar102,(undefined1  [32])(line->primIDs).field_0);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  fVar3 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar95._4_4_ = fVar3;
  auVar95._0_4_ = fVar3;
  auVar95._8_4_ = fVar3;
  auVar95._12_4_ = fVar3;
  auVar95._16_4_ = fVar3;
  auVar95._20_4_ = fVar3;
  auVar95._24_4_ = fVar3;
  auVar95._28_4_ = fVar3;
  auVar102._0_16_ = *(undefined1 (*) [16])&(ray->super_RayK<1>).dir;
  auVar102._16_4_ = (ray->super_RayK<1>).tfar;
  auVar102._20_4_ = (ray->super_RayK<1>).mask;
  auVar102._24_4_ = (ray->super_RayK<1>).id;
  auVar102._28_4_ = (ray->super_RayK<1>).flags;
  auVar146 = *(undefined1 (*) [32])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar29 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar5 = (ray->super_RayK<1>).tfar;
  fVar6 = (float)(ray->super_RayK<1>).mask;
  fVar19 = (float)(ray->super_RayK<1>).id;
  fVar20 = (float)(ray->super_RayK<1>).flags;
  fVar21 = (ray->Ng).field_0.field_0.x;
  auVar192._4_4_ = fVar4 * fVar4;
  auVar192._0_4_ = fVar29 * fVar29;
  auVar192._8_4_ = fVar5 * fVar5;
  auVar192._12_4_ = fVar6 * fVar6;
  auVar192._16_4_ = fVar19 * fVar19;
  auVar192._20_4_ = fVar20 * fVar20;
  auVar192._24_4_ = fVar21 * fVar21;
  auVar192._28_4_ = (ray->Ng).field_0.field_0.y;
  auVar83 = vfmadd231ps_fma(auVar192,auVar146,auVar146);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar102);
  uVar121 = auVar83._0_4_;
  auVar85._4_4_ = uVar121;
  auVar85._0_4_ = uVar121;
  auVar85._8_4_ = uVar121;
  auVar85._12_4_ = uVar121;
  auVar85._16_4_ = uVar121;
  auVar85._20_4_ = uVar121;
  auVar85._24_4_ = uVar121;
  auVar85._28_4_ = uVar121;
  auVar102 = vrcpps_avx(auVar85);
  auVar83 = vfnmadd213ps_fma(auVar85,auVar102,auVar142);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar102,auVar102);
  fVar29 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar143._4_4_ = fVar29;
  auVar143._0_4_ = fVar29;
  auVar143._8_4_ = fVar29;
  auVar143._12_4_ = fVar29;
  auVar143._16_4_ = fVar29;
  auVar143._20_4_ = fVar29;
  auVar143._24_4_ = fVar29;
  auVar143._28_4_ = fVar29;
  auVar102 = vsubps_avx(ZEXT1632(CONCAT412((auVar37._12_4_ + auVar41._12_4_) * 0.5,
                                           CONCAT48((auVar37._8_4_ + auVar41._8_4_) * 0.5,
                                                    CONCAT44((auVar37._4_4_ + auVar41._4_4_) * 0.5,
                                                             (auVar37._0_4_ + auVar41._0_4_) * 0.5))
                                          )),auVar95);
  auVar146 = vsubps_avx(ZEXT1632(CONCAT412((auVar38._12_4_ + auVar42._12_4_) * 0.5,
                                           CONCAT48((auVar38._8_4_ + auVar42._8_4_) * 0.5,
                                                    CONCAT44((auVar38._4_4_ + auVar42._4_4_) * 0.5,
                                                             (auVar38._0_4_ + auVar42._0_4_) * 0.5))
                                          )),auVar143);
  local_4e0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar30._4_4_ = (float)local_4e0._4_4_ * auVar146._4_4_;
  auVar30._0_4_ = (float)local_4e0._4_4_ * auVar146._0_4_;
  auVar30._8_4_ = (float)local_4e0._4_4_ * auVar146._8_4_;
  auVar30._12_4_ = (float)local_4e0._4_4_ * auVar146._12_4_;
  auVar30._16_4_ = (float)local_4e0._4_4_ * auVar146._16_4_;
  auVar30._20_4_ = (float)local_4e0._4_4_ * auVar146._20_4_;
  auVar30._24_4_ = (float)local_4e0._4_4_ * auVar146._24_4_;
  auVar30._28_4_ = auVar146._28_4_;
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_460._4_4_ = fVar4;
  local_460._0_4_ = fVar4;
  local_460._8_4_ = fVar4;
  local_460._12_4_ = fVar4;
  local_460._16_4_ = fVar4;
  local_460._20_4_ = fVar4;
  local_460._24_4_ = fVar4;
  local_460._28_4_ = fVar4;
  auVar44 = vfmadd231ps_fma(auVar30,local_460,auVar102);
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar124._4_4_ = fVar5;
  auVar124._0_4_ = fVar5;
  auVar124._8_4_ = fVar5;
  auVar124._12_4_ = fVar5;
  auVar124._16_4_ = fVar5;
  auVar124._20_4_ = fVar5;
  auVar124._24_4_ = fVar5;
  auVar124._28_4_ = fVar5;
  fVar6 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_520._4_4_ = fVar6;
  local_520._0_4_ = fVar6;
  local_520._8_4_ = fVar6;
  local_520._12_4_ = fVar6;
  local_520._16_4_ = fVar6;
  local_520._20_4_ = fVar6;
  local_520._24_4_ = fVar6;
  local_520._28_4_ = fVar6;
  auVar102 = vsubps_avx(ZEXT1632(CONCAT412((auVar36._12_4_ + auVar40._12_4_) * 0.5,
                                           CONCAT48((auVar36._8_4_ + auVar40._8_4_) * 0.5,
                                                    CONCAT44((auVar36._4_4_ + auVar40._4_4_) * 0.5,
                                                             (auVar36._0_4_ + auVar40._0_4_) * 0.5))
                                          )),auVar124);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),local_520,auVar102);
  local_560 = auVar44._0_4_ * auVar83._0_4_;
  fStack_55c = auVar44._4_4_ * auVar83._4_4_;
  fStack_558 = auVar44._8_4_ * auVar83._8_4_;
  fStack_554 = auVar44._12_4_ * auVar83._12_4_;
  fStack_544 = auVar102._28_4_;
  auVar125._0_4_ = fVar5 + fVar6 * local_560;
  auVar125._4_4_ = fVar5 + fVar6 * fStack_55c;
  auVar125._8_4_ = fVar5 + fVar6 * fStack_558;
  auVar125._12_4_ = fVar5 + fVar6 * fStack_554;
  auVar125._16_4_ = fVar5 + fVar6 * 0.0;
  auVar125._20_4_ = fVar5 + fVar6 * 0.0;
  auVar125._24_4_ = fVar5 + fVar6 * 0.0;
  auVar125._28_4_ = fVar5 + 0.0;
  auVar131._0_4_ = fVar3 + fVar4 * local_560;
  auVar131._4_4_ = fVar3 + fVar4 * fStack_55c;
  auVar131._8_4_ = fVar3 + fVar4 * fStack_558;
  auVar131._12_4_ = fVar3 + fVar4 * fStack_554;
  auVar131._16_4_ = fVar3 + fVar4 * 0.0;
  auVar131._20_4_ = fVar3 + fVar4 * 0.0;
  auVar131._24_4_ = fVar3 + fVar4 * 0.0;
  auVar131._28_4_ = fVar3 + 0.0;
  uStack_550 = 0;
  uStack_54c = 0;
  uStack_548 = 0;
  auVar144._0_4_ = fVar29 + (float)local_4e0._4_4_ * local_560;
  auVar144._4_4_ = fVar29 + (float)local_4e0._4_4_ * fStack_55c;
  auVar144._8_4_ = fVar29 + (float)local_4e0._4_4_ * fStack_558;
  auVar144._12_4_ = fVar29 + (float)local_4e0._4_4_ * fStack_554;
  auVar144._16_4_ = fVar29 + (float)local_4e0._4_4_ * 0.0;
  auVar144._20_4_ = fVar29 + (float)local_4e0._4_4_ * 0.0;
  auVar144._24_4_ = fVar29 + (float)local_4e0._4_4_ * 0.0;
  auVar144._28_4_ = fVar29 + 0.0;
  local_3a0 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar36));
  _local_540 = vsubps_avx(auVar125,ZEXT1632(auVar36));
  local_3c0 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar37));
  _local_320 = vsubps_avx(auVar131,ZEXT1632(auVar37));
  local_3e0 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar38));
  _local_480 = vsubps_avx(auVar144,ZEXT1632(auVar38));
  fVar20 = local_3e0._0_4_;
  auVar138._0_4_ = fVar20 * fVar20;
  fVar23 = local_3e0._4_4_;
  auVar138._4_4_ = fVar23 * fVar23;
  fVar24 = local_3e0._8_4_;
  auVar138._8_4_ = fVar24 * fVar24;
  fVar25 = local_3e0._12_4_;
  auVar138._12_4_ = fVar25 * fVar25;
  fVar26 = local_3e0._16_4_;
  auVar138._16_4_ = fVar26 * fVar26;
  fVar27 = local_3e0._20_4_;
  auVar138._20_4_ = fVar27 * fVar27;
  fVar28 = local_3e0._24_4_;
  auVar138._24_4_ = fVar28 * fVar28;
  auVar138._28_4_ = 0;
  auVar83 = vfmadd231ps_fma(auVar138,local_3c0,local_3c0);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_3a0,local_3a0);
  fVar201 = local_480._0_4_;
  auVar183._0_4_ = fVar201 * fVar20;
  fVar206 = local_480._4_4_;
  auVar183._4_4_ = fVar206 * fVar23;
  fVar207 = local_480._8_4_;
  auVar183._8_4_ = fVar207 * fVar24;
  fVar208 = local_480._12_4_;
  auVar183._12_4_ = fVar208 * fVar25;
  fVar209 = local_480._16_4_;
  auVar183._16_4_ = fVar209 * fVar26;
  fVar210 = local_480._20_4_;
  auVar183._20_4_ = fVar210 * fVar27;
  fVar211 = local_480._24_4_;
  auVar183._24_4_ = fVar211 * fVar28;
  auVar183._28_4_ = 0;
  auVar36 = vfmadd231ps_fma(auVar183,_local_320,local_3c0);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),_local_540,local_3a0);
  auVar175._0_4_ = (float)local_4e0._4_4_ * fVar20;
  auVar175._4_4_ = (float)local_4e0._4_4_ * fVar23;
  auVar175._8_4_ = (float)local_4e0._4_4_ * fVar24;
  auVar175._12_4_ = (float)local_4e0._4_4_ * fVar25;
  auVar175._16_4_ = (float)local_4e0._4_4_ * fVar26;
  auVar175._20_4_ = (float)local_4e0._4_4_ * fVar27;
  auVar175._24_4_ = (float)local_4e0._4_4_ * fVar28;
  auVar175._28_4_ = 0;
  auVar37 = vfmadd231ps_fma(auVar175,local_460,local_3c0);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),local_520,local_3a0);
  auVar102 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar43));
  fVar21 = auVar102._0_4_;
  fVar118 = auVar102._4_4_;
  fVar120 = auVar102._8_4_;
  fVar150 = auVar102._12_4_;
  fVar154 = auVar102._16_4_;
  fVar156 = auVar102._20_4_;
  fVar158 = auVar102._24_4_;
  fVar45 = local_3a0._28_4_;
  fVar3 = auVar83._0_4_;
  fVar140 = fVar21 * fVar21 + fVar3;
  fVar29 = auVar83._4_4_;
  fVar149 = fVar118 * fVar118 + fVar29;
  fVar5 = auVar83._8_4_;
  fVar151 = fVar120 * fVar120 + fVar5;
  fVar19 = auVar83._12_4_;
  fVar153 = fVar150 * fVar150 + fVar19;
  fVar155 = fVar154 * fVar154 + 0.0;
  fVar157 = fVar156 * fVar156 + 0.0;
  fVar159 = fVar158 * fVar158 + 0.0;
  local_4e0._0_4_ = local_4e0._4_4_;
  fStack_4d8 = (float)local_4e0._4_4_;
  fStack_4d4 = (float)local_4e0._4_4_;
  fStack_4d0 = (float)local_4e0._4_4_;
  fStack_4cc = (float)local_4e0._4_4_;
  fStack_4c8 = (float)local_4e0._4_4_;
  fStack_4c4 = (float)local_4e0._4_4_;
  auVar146._4_4_ = (float)local_4e0._4_4_ * fVar206;
  auVar146._0_4_ = (float)local_4e0._4_4_ * fVar201;
  auVar146._8_4_ = (float)local_4e0._4_4_ * fVar207;
  auVar146._12_4_ = (float)local_4e0._4_4_ * fVar208;
  auVar146._16_4_ = (float)local_4e0._4_4_ * fVar209;
  auVar146._20_4_ = (float)local_4e0._4_4_ * fVar210;
  auVar146._24_4_ = (float)local_4e0._4_4_ * fVar211;
  auVar146._28_4_ = fVar45;
  auVar38 = vfmadd231ps_fma(auVar146,local_460,_local_320);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),local_520,_local_540);
  fVar129 = fVar3 * fVar3;
  fVar134 = fVar29 * fVar29;
  fVar135 = fVar5 * fVar5;
  fVar136 = fVar19 * fVar19;
  uStack_224 = auVar131._28_4_;
  _local_240 = ZEXT1628(CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(fVar134,fVar129))));
  fVar22 = auVar36._0_4_;
  fVar172 = auVar37._0_4_;
  fVar119 = auVar36._4_4_;
  fVar179 = auVar37._4_4_;
  fVar141 = auVar36._8_4_;
  fVar180 = auVar37._8_4_;
  fVar152 = auVar36._12_4_;
  fVar181 = auVar37._12_4_;
  fVar46 = local_3c0._28_4_;
  auVar108._4_4_ = fVar149 * fVar179 * fVar119;
  auVar108._0_4_ = fVar140 * fVar172 * fVar22;
  auVar108._8_4_ = fVar151 * fVar180 * fVar141;
  auVar108._12_4_ = fVar153 * fVar181 * fVar152;
  auVar108._16_4_ = fVar155 * 0.0;
  auVar108._20_4_ = fVar157 * 0.0;
  auVar108._24_4_ = fVar159 * 0.0;
  auVar108._28_4_ = fVar46;
  auVar146 = vsubps_avx(ZEXT1632(CONCAT412(fVar136 * auVar38._12_4_,
                                           CONCAT48(fVar135 * auVar38._8_4_,
                                                    CONCAT44(fVar134 * auVar38._4_4_,
                                                             fVar129 * auVar38._0_4_)))),auVar108);
  auVar139 = ZEXT1632(auVar83);
  fVar105 = auVar39._0_4_;
  fVar104 = fVar105 * fVar3;
  fVar113 = auVar39._4_4_;
  fVar112 = fVar113 * fVar29;
  fVar115 = auVar39._8_4_;
  fVar114 = fVar115 * fVar5;
  fVar117 = auVar39._12_4_;
  fVar116 = fVar117 * fVar19;
  auVar96._0_4_ = fVar104 * fVar21 * fVar172 + auVar146._0_4_;
  auVar96._4_4_ = fVar112 * fVar118 * fVar179 + auVar146._4_4_;
  auVar96._8_4_ = fVar114 * fVar120 * fVar180 + auVar146._8_4_;
  auVar96._12_4_ = fVar116 * fVar150 * fVar181 + auVar146._12_4_;
  auVar96._16_4_ = fVar154 * 0.0 * 0.0 + auVar146._16_4_;
  auVar96._20_4_ = fVar156 * 0.0 * 0.0 + auVar146._20_4_;
  auVar96._24_4_ = fVar158 * 0.0 * 0.0 + auVar146._24_4_;
  auVar96._28_4_ = fVar46 + auVar146._28_4_;
  auVar199 = _local_480;
  auVar31._4_4_ = fVar206 * fVar206;
  auVar31._0_4_ = fVar201 * fVar201;
  auVar31._8_4_ = fVar207 * fVar207;
  auVar31._12_4_ = fVar208 * fVar208;
  auVar31._16_4_ = fVar209 * fVar209;
  auVar31._20_4_ = fVar210 * fVar210;
  auVar31._24_4_ = fVar211 * fVar211;
  auVar31._28_4_ = auVar146._28_4_;
  auVar101 = _local_320;
  auVar83 = vfmadd231ps_fma(auVar31,_local_320,_local_320);
  auVar192 = _local_540;
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),_local_540,_local_540);
  auVar133._4_4_ = fVar149 * fVar119 * fVar119;
  auVar133._0_4_ = fVar140 * fVar22 * fVar22;
  auVar133._8_4_ = fVar151 * fVar141 * fVar141;
  auVar133._12_4_ = fVar153 * fVar152 * fVar152;
  auVar133._16_4_ = fVar155 * 0.0;
  auVar133._20_4_ = fVar157 * 0.0;
  auVar133._24_4_ = fVar159 * 0.0;
  auVar133._28_4_ = local_540._28_4_;
  auVar146 = vsubps_avx(ZEXT1632(CONCAT412(fVar136 * auVar83._12_4_,
                                           CONCAT48(fVar135 * auVar83._8_4_,
                                                    CONCAT44(fVar134 * auVar83._4_4_,
                                                             fVar129 * auVar83._0_4_)))),auVar133);
  auVar33._4_4_ = fVar119 * (fVar118 + fVar118);
  auVar33._0_4_ = fVar22 * (fVar21 + fVar21);
  auVar33._8_4_ = fVar141 * (fVar120 + fVar120);
  auVar33._12_4_ = fVar152 * (fVar150 + fVar150);
  auVar33._16_4_ = (fVar154 + fVar154) * 0.0;
  auVar33._20_4_ = (fVar156 + fVar156) * 0.0;
  auVar33._24_4_ = (fVar158 + fVar158) * 0.0;
  auVar33._28_4_ = auVar102._28_4_ + auVar102._28_4_;
  auVar102 = vsubps_avx(auVar33,ZEXT1632(CONCAT412(fVar116,CONCAT48(fVar114,CONCAT44(fVar112,fVar104
                                                                                    )))));
  fVar160 = fVar172 * fVar172;
  fVar165 = fVar179 * fVar179;
  fVar166 = fVar180 * fVar180;
  fVar167 = fVar181 * fVar181;
  auVar34._4_4_ = fVar149 * fVar165;
  auVar34._0_4_ = fVar140 * fVar160;
  auVar34._8_4_ = fVar151 * fVar166;
  auVar34._12_4_ = fVar153 * fVar167;
  auVar34._16_4_ = fVar155 * 0.0;
  auVar34._20_4_ = fVar157 * 0.0;
  auVar34._24_4_ = fVar159 * 0.0;
  auVar34._28_4_ = 0;
  auVar100 = vsubps_avx(_local_240,auVar34);
  auVar35._4_4_ = auVar100._4_4_ * (auVar146._4_4_ + fVar112 * auVar102._4_4_);
  auVar35._0_4_ = auVar100._0_4_ * (auVar146._0_4_ + fVar104 * auVar102._0_4_);
  auVar35._8_4_ = auVar100._8_4_ * (auVar146._8_4_ + fVar114 * auVar102._8_4_);
  auVar35._12_4_ = auVar100._12_4_ * (auVar146._12_4_ + fVar116 * auVar102._12_4_);
  auVar35._16_4_ = auVar100._16_4_ * (auVar146._16_4_ + auVar102._16_4_ * 0.0);
  auVar35._20_4_ = auVar100._20_4_ * (auVar146._20_4_ + auVar102._20_4_ * 0.0);
  auVar35._24_4_ = auVar100._24_4_ * (auVar146._24_4_ + auVar102._24_4_ * 0.0);
  auVar35._28_4_ = auVar146._28_4_ + 0.0;
  auVar47._4_4_ = auVar96._4_4_ * auVar96._4_4_;
  auVar47._0_4_ = auVar96._0_4_ * auVar96._0_4_;
  auVar47._8_4_ = auVar96._8_4_ * auVar96._8_4_;
  auVar47._12_4_ = auVar96._12_4_ * auVar96._12_4_;
  auVar47._16_4_ = auVar96._16_4_ * auVar96._16_4_;
  auVar47._20_4_ = auVar96._20_4_ * auVar96._20_4_;
  auVar47._24_4_ = auVar96._24_4_ * auVar96._24_4_;
  auVar47._28_4_ = auVar102._28_4_;
  auVar146 = vsubps_avx(auVar47,auVar35);
  auVar132 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar102 = vcmpps_avx(auVar146,auVar132,5);
  auVar169 = auVar102 & ~auVar94;
  if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar169 >> 0x7f,0) == '\0') &&
        (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar169 >> 0xbf,0) == '\0') &&
      (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar169[0x1f]) {
    return;
  }
  auVar102 = vandnps_avx(auVar94,auVar102);
  auVar83 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar30 = vsubps_avx(auVar125,ZEXT1632(auVar40));
  auVar94 = vsubps_avx(auVar131,ZEXT1632(auVar41));
  auVar108 = vsubps_avx(auVar144,ZEXT1632(auVar42));
  auVar145._2_2_ = 0;
  auVar145._0_2_ = uVar8;
  auVar146 = vsqrtps_avx(auVar146);
  auVar145._4_2_ = uVar8;
  auVar145._6_2_ = 0;
  auVar145._8_2_ = uVar8;
  auVar145._10_2_ = 0;
  auVar145._12_2_ = uVar8;
  auVar145._14_2_ = 0;
  auVar145._16_2_ = uVar8;
  auVar145._18_2_ = 0;
  auVar145._20_2_ = uVar8;
  auVar145._22_2_ = 0;
  auVar145._24_2_ = uVar8;
  auVar145._26_2_ = 0;
  auVar145._28_2_ = uVar8;
  auVar145._30_2_ = 0;
  _local_380 = CONCAT412(fVar167,CONCAT48(fVar166,CONCAT44(fVar165,fVar160)));
  _local_380 = ZEXT1628(_local_380);
  fStack_364 = local_320._28_4_;
  auVar102 = vrcpps_avx(auVar100);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar102,auVar100,auVar86);
  auVar194._8_4_ = 0x7fffffff;
  auVar194._0_8_ = 0x7fffffff7fffffff;
  auVar194._12_4_ = 0x7fffffff;
  auVar194._16_4_ = 0x7fffffff;
  auVar194._20_4_ = 0x7fffffff;
  auVar194._24_4_ = 0x7fffffff;
  auVar194._28_4_ = 0x7fffffff;
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar102,auVar102);
  auVar102 = vandps_avx(auVar194,auVar100);
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  auVar162._16_4_ = 0x219392ef;
  auVar162._20_4_ = 0x219392ef;
  auVar162._24_4_ = 0x219392ef;
  auVar162._28_4_ = 0x219392ef;
  auVar102 = vcmpps_avx(auVar102,auVar162,2);
  uVar81 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
  auVar195._0_8_ = uVar81 ^ 0x8000000080000000;
  auVar195._8_4_ = -auVar96._8_4_;
  auVar195._12_4_ = -auVar96._12_4_;
  auVar195._16_4_ = -auVar96._16_4_;
  auVar195._20_4_ = -auVar96._20_4_;
  auVar195._24_4_ = -auVar96._24_4_;
  auVar195._28_4_ = -auVar96._28_4_;
  auVar100 = vsubps_avx(auVar195,auVar146);
  auVar169 = vsubps_avx(auVar146,auVar96);
  auVar87._8_4_ = 0xff800000;
  auVar87._0_8_ = 0xff800000ff800000;
  auVar87._12_4_ = 0xff800000;
  auVar87._16_4_ = 0xff800000;
  auVar87._20_4_ = 0xff800000;
  auVar87._24_4_ = 0xff800000;
  auVar87._28_4_ = 0xff800000;
  auVar48._4_4_ = auVar100._4_4_ * auVar36._4_4_;
  auVar48._0_4_ = auVar100._0_4_ * auVar36._0_4_;
  auVar48._8_4_ = auVar100._8_4_ * auVar36._8_4_;
  auVar48._12_4_ = auVar100._12_4_ * auVar36._12_4_;
  auVar48._16_4_ = auVar100._16_4_ * 0.0;
  auVar48._20_4_ = auVar100._20_4_ * 0.0;
  auVar48._24_4_ = auVar100._24_4_ * 0.0;
  auVar48._28_4_ = auVar100._28_4_;
  auVar146 = vblendvps_avx(auVar48,auVar87,auVar102);
  auVar49._4_4_ = auVar36._4_4_ * auVar169._4_4_;
  auVar49._0_4_ = auVar36._0_4_ * auVar169._0_4_;
  auVar49._8_4_ = auVar36._8_4_ * auVar169._8_4_;
  auVar49._12_4_ = auVar36._12_4_ * auVar169._12_4_;
  auVar49._16_4_ = auVar169._16_4_ * 0.0;
  auVar49._20_4_ = auVar169._20_4_ * 0.0;
  auVar49._24_4_ = auVar169._24_4_ * 0.0;
  auVar49._28_4_ = auVar169._28_4_;
  auVar88._8_4_ = 0x7f800000;
  auVar88._0_8_ = 0x7f8000007f800000;
  auVar88._12_4_ = 0x7f800000;
  auVar88._16_4_ = 0x7f800000;
  auVar88._20_4_ = 0x7f800000;
  auVar88._24_4_ = 0x7f800000;
  auVar88._28_4_ = 0x7f800000;
  auVar100 = vblendvps_avx(auVar49,auVar88,auVar102);
  auVar102 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar31 = vpand_avx2(auVar145,auVar102);
  auVar189._2_2_ = 0;
  auVar189._0_2_ = uVar7;
  auVar189._4_2_ = uVar7;
  auVar189._6_2_ = 0;
  auVar189._8_2_ = uVar7;
  auVar189._10_2_ = 0;
  auVar189._12_2_ = uVar7;
  auVar189._14_2_ = 0;
  auVar189._16_2_ = uVar7;
  auVar189._18_2_ = 0;
  auVar189._20_2_ = uVar7;
  auVar189._22_2_ = 0;
  auVar189._24_2_ = uVar7;
  auVar189._26_2_ = 0;
  auVar189._28_2_ = uVar7;
  auVar189._30_2_ = 0;
  auVar32 = vpand_avx2(auVar189,auVar102);
  auVar126._0_4_ = fVar22 + fVar172 * auVar146._0_4_;
  auVar126._4_4_ = fVar119 + fVar179 * auVar146._4_4_;
  auVar126._8_4_ = fVar141 + fVar180 * auVar146._8_4_;
  auVar126._12_4_ = fVar152 + fVar181 * auVar146._12_4_;
  auVar126._16_4_ = auVar146._16_4_ * 0.0 + 0.0;
  auVar126._20_4_ = auVar146._20_4_ * 0.0 + 0.0;
  auVar126._24_4_ = auVar146._24_4_ * 0.0 + 0.0;
  auVar126._28_4_ = (float)(uint)uVar7 + 0.0;
  auVar102 = vcmpps_avx(auVar126,auVar132,6);
  auVar169 = vcmpps_avx(auVar126,auVar139,1);
  auVar102 = vandps_avx(auVar169,auVar102);
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar36 = vpand_avx(auVar83,auVar36);
  auVar102 = vpmovsxwd_avx2(auVar36);
  local_500 = vblendvps_avx(auVar88,auVar146,auVar102);
  fStack_e4 = local_500._28_4_;
  local_400._0_4_ = fVar22 + fVar172 * auVar100._0_4_;
  local_400._4_4_ = fVar119 + fVar179 * auVar100._4_4_;
  fStack_3f8 = fVar141 + fVar180 * auVar100._8_4_;
  fStack_3f4 = fVar152 + fVar181 * auVar100._12_4_;
  fStack_3f0 = auVar100._16_4_ * 0.0 + 0.0;
  fStack_3ec = auVar100._20_4_ * 0.0 + 0.0;
  fStack_3e8 = auVar100._24_4_ * 0.0 + 0.0;
  register0x000012dc = fStack_e4 + 0.0;
  auVar133 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar102 = vcmpps_avx(_local_400,auVar133,6);
  auVar169 = vcmpps_avx(_local_400,auVar139,1);
  auVar102 = vandps_avx(auVar169,auVar102);
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar36 = vpand_avx(auVar83,auVar36);
  auVar102 = vpmovsxwd_avx2(auVar36);
  local_200 = vblendvps_avx(auVar87,auVar100,auVar102);
  auVar132 = vpcmpeqd_avx2(auVar31,auVar133);
  auVar169 = vpcmpeqd_avx2(auVar32,auVar133);
  auVar102 = vrcpps_avx(ZEXT1632(auVar37));
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = 0x3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar127._16_4_ = 0x3f800000;
  auVar127._20_4_ = 0x3f800000;
  auVar127._24_4_ = 0x3f800000;
  auVar127._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar37),auVar127);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar102,auVar102);
  auVar50._4_4_ = fVar179 * (float)local_540._4_4_;
  auVar50._0_4_ = fVar172 * (float)local_540._0_4_;
  auVar50._8_4_ = fVar180 * fStack_538;
  auVar50._12_4_ = fVar181 * fStack_534;
  auVar50._16_4_ = (float)uStack_530 * 0.0;
  auVar50._20_4_ = uStack_530._4_4_ * 0.0;
  auVar50._24_4_ = (float)uStack_528 * 0.0;
  auVar50._28_4_ = auVar102._28_4_;
  auVar51._4_4_ = fVar6 * fVar119;
  auVar51._0_4_ = fVar6 * fVar22;
  auVar51._8_4_ = fVar6 * fVar141;
  auVar51._12_4_ = fVar6 * fVar152;
  auVar51._16_4_ = fVar6 * 0.0;
  auVar51._20_4_ = fVar6 * 0.0;
  auVar51._24_4_ = fVar6 * 0.0;
  auVar51._28_4_ = 0x3f800000;
  auVar102 = vsubps_avx(auVar50,auVar51);
  auVar52._4_4_ = fVar179 * (float)local_320._4_4_;
  auVar52._0_4_ = fVar172 * (float)local_320._0_4_;
  auVar52._8_4_ = fVar180 * fStack_318;
  auVar52._12_4_ = fVar181 * fStack_314;
  auVar52._16_4_ = fStack_310 * 0.0;
  auVar52._20_4_ = fStack_30c * 0.0;
  auVar52._24_4_ = fStack_308 * 0.0;
  auVar52._28_4_ = 0x3f800000;
  auVar53._4_4_ = fVar119 * fVar4;
  auVar53._0_4_ = fVar22 * fVar4;
  auVar53._8_4_ = fVar141 * fVar4;
  auVar53._12_4_ = fVar152 * fVar4;
  auVar53._16_4_ = fVar4 * 0.0;
  auVar53._20_4_ = fVar4 * 0.0;
  auVar53._24_4_ = fVar4 * 0.0;
  auVar53._28_4_ = auVar31._28_4_;
  auVar100 = vsubps_avx(auVar52,auVar53);
  auVar54._4_4_ = fVar179 * fVar206;
  auVar54._0_4_ = fVar172 * fVar201;
  auVar54._8_4_ = fVar180 * fVar207;
  auVar54._12_4_ = fVar181 * fVar208;
  auVar54._16_4_ = fVar209 * 0.0;
  auVar54._20_4_ = fVar210 * 0.0;
  auVar54._24_4_ = fVar211 * 0.0;
  auVar54._28_4_ = auVar31._28_4_;
  auVar55._4_4_ = (float)local_4e0._4_4_ * fVar119;
  auVar55._0_4_ = (float)local_4e0._4_4_ * fVar22;
  auVar55._8_4_ = (float)local_4e0._4_4_ * fVar141;
  auVar55._12_4_ = (float)local_4e0._4_4_ * fVar152;
  auVar55._16_4_ = (float)local_4e0._4_4_ * 0.0;
  auVar55._20_4_ = (float)local_4e0._4_4_ * 0.0;
  auVar55._24_4_ = (float)local_4e0._4_4_ * 0.0;
  auVar55._28_4_ = auVar146._28_4_;
  auVar146 = vsubps_avx(auVar54,auVar55);
  auVar56._4_4_ = auVar146._4_4_ * auVar146._4_4_;
  auVar56._0_4_ = auVar146._0_4_ * auVar146._0_4_;
  auVar56._8_4_ = auVar146._8_4_ * auVar146._8_4_;
  auVar56._12_4_ = auVar146._12_4_ * auVar146._12_4_;
  auVar56._16_4_ = auVar146._16_4_ * auVar146._16_4_;
  auVar56._20_4_ = auVar146._20_4_ * auVar146._20_4_;
  auVar56._24_4_ = auVar146._24_4_ * auVar146._24_4_;
  auVar56._28_4_ = auVar146._28_4_;
  auVar36 = vfmadd231ps_fma(auVar56,auVar100,auVar100);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar102,auVar102);
  auVar102 = vcmpps_avx(ZEXT1632(auVar36),
                        ZEXT1632(CONCAT412(fVar167 * fVar117 * fVar117,
                                           CONCAT48(fVar166 * fVar115 * fVar115,
                                                    CONCAT44(fVar165 * fVar113 * fVar113,
                                                             fVar160 * fVar105 * fVar105)))),1);
  auVar102 = vandps_avx(auVar102,auVar169);
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar57._4_4_ = auVar37._4_4_ * -fVar119;
  auVar57._0_4_ = auVar37._0_4_ * -fVar22;
  auVar57._8_4_ = auVar37._8_4_ * -fVar141;
  auVar57._12_4_ = auVar37._12_4_ * -fVar152;
  auVar57._16_4_ = 0x80000000;
  auVar57._20_4_ = 0x80000000;
  auVar57._24_4_ = 0x80000000;
  auVar57._28_4_ = 0x80000000;
  auVar36 = vpand_avx(auVar83,auVar36);
  auVar102 = vpmovsxwd_avx2(auVar36);
  auVar97._8_4_ = 0x7f800000;
  auVar97._0_8_ = 0x7f8000007f800000;
  auVar97._12_4_ = 0x7f800000;
  auVar97._16_4_ = 0x7f800000;
  auVar97._20_4_ = 0x7f800000;
  auVar97._24_4_ = 0x7f800000;
  auVar97._28_4_ = 0x7f800000;
  local_80 = vblendvps_avx(auVar97,auVar57,auVar102);
  local_4a0._0_4_ = auVar108._0_4_;
  local_4a0._4_4_ = auVar108._4_4_;
  fStack_498 = auVar108._8_4_;
  fStack_494 = auVar108._12_4_;
  fStack_490 = auVar108._16_4_;
  fStack_48c = auVar108._20_4_;
  fStack_488 = auVar108._24_4_;
  uStack_484 = auVar108._28_4_;
  auVar58._4_4_ = (float)local_4a0._4_4_ * fVar23;
  auVar58._0_4_ = (float)local_4a0._0_4_ * fVar20;
  auVar58._8_4_ = fStack_498 * fVar24;
  auVar58._12_4_ = fStack_494 * fVar25;
  auVar58._16_4_ = fStack_490 * fVar26;
  auVar58._20_4_ = fStack_48c * fVar27;
  auVar58._24_4_ = fStack_488 * fVar28;
  auVar58._28_4_ = auVar102._28_4_;
  auVar36 = vfmadd231ps_fma(auVar58,auVar94,local_3c0);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar30,local_3a0);
  auVar59._4_4_ = fVar179 * auVar30._4_4_;
  auVar59._0_4_ = fVar172 * auVar30._0_4_;
  auVar59._8_4_ = fVar180 * auVar30._8_4_;
  auVar59._12_4_ = fVar181 * auVar30._12_4_;
  auVar59._16_4_ = auVar30._16_4_ * 0.0;
  auVar59._20_4_ = auVar30._20_4_ * 0.0;
  auVar59._24_4_ = auVar30._24_4_ * 0.0;
  auVar59._28_4_ = 0x80000000;
  auVar60._4_4_ = fVar179 * auVar94._4_4_;
  auVar60._0_4_ = fVar172 * auVar94._0_4_;
  auVar60._8_4_ = fVar180 * auVar94._8_4_;
  auVar60._12_4_ = fVar181 * auVar94._12_4_;
  auVar60._16_4_ = auVar94._16_4_ * 0.0;
  auVar60._20_4_ = auVar94._20_4_ * 0.0;
  auVar60._24_4_ = auVar94._24_4_ * 0.0;
  auVar60._28_4_ = auVar94._28_4_;
  auVar61._4_4_ = fVar179 * (float)local_4a0._4_4_;
  auVar61._0_4_ = fVar172 * (float)local_4a0._0_4_;
  auVar61._8_4_ = fVar180 * fStack_498;
  auVar61._12_4_ = fVar181 * fStack_494;
  auVar61._16_4_ = fStack_490 * 0.0;
  auVar61._20_4_ = fStack_48c * 0.0;
  auVar61._24_4_ = fStack_488 * 0.0;
  auVar61._28_4_ = uStack_484;
  fVar22 = auVar36._0_4_;
  auVar176._0_4_ = fVar6 * fVar22;
  fVar119 = auVar36._4_4_;
  auVar176._4_4_ = fVar6 * fVar119;
  fVar141 = auVar36._8_4_;
  auVar176._8_4_ = fVar6 * fVar141;
  fVar152 = auVar36._12_4_;
  auVar176._12_4_ = fVar6 * fVar152;
  auVar176._16_4_ = fVar6 * 0.0;
  auVar176._20_4_ = fVar6 * 0.0;
  auVar176._24_4_ = fVar6 * 0.0;
  auVar176._28_4_ = 0;
  auVar102 = vsubps_avx(auVar59,auVar176);
  auVar62._4_4_ = fVar4 * fVar119;
  auVar62._0_4_ = fVar4 * fVar22;
  auVar62._8_4_ = fVar4 * fVar141;
  auVar62._12_4_ = fVar4 * fVar152;
  auVar62._16_4_ = fVar4 * 0.0;
  auVar62._20_4_ = fVar4 * 0.0;
  auVar62._24_4_ = fVar4 * 0.0;
  auVar62._28_4_ = 0;
  auVar146 = vsubps_avx(auVar60,auVar62);
  auVar63._4_4_ = (float)local_4e0._4_4_ * fVar119;
  auVar63._0_4_ = (float)local_4e0._4_4_ * fVar22;
  auVar63._8_4_ = (float)local_4e0._4_4_ * fVar141;
  auVar63._12_4_ = (float)local_4e0._4_4_ * fVar152;
  auVar63._16_4_ = (float)local_4e0._4_4_ * 0.0;
  auVar63._20_4_ = (float)local_4e0._4_4_ * 0.0;
  auVar63._24_4_ = (float)local_4e0._4_4_ * 0.0;
  auVar63._28_4_ = 0;
  auVar100 = vsubps_avx(auVar61,auVar63);
  auVar64._4_4_ = auVar100._4_4_ * auVar100._4_4_;
  auVar64._0_4_ = auVar100._0_4_ * auVar100._0_4_;
  auVar64._8_4_ = auVar100._8_4_ * auVar100._8_4_;
  auVar64._12_4_ = auVar100._12_4_ * auVar100._12_4_;
  auVar64._16_4_ = auVar100._16_4_ * auVar100._16_4_;
  auVar64._20_4_ = auVar100._20_4_ * auVar100._20_4_;
  auVar64._24_4_ = auVar100._24_4_ * auVar100._24_4_;
  auVar64._28_4_ = auVar100._28_4_;
  auVar36 = vfmadd231ps_fma(auVar64,auVar146,auVar146);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar102,auVar102);
  local_340._0_4_ = auVar43._0_4_;
  local_340._4_4_ = auVar43._4_4_;
  fStack_338 = auVar43._8_4_;
  fStack_334 = auVar43._12_4_;
  auVar65._28_4_ = auVar146._28_4_;
  auVar65._0_28_ =
       ZEXT1628(CONCAT412(fVar167 * fStack_334 * fStack_334,
                          CONCAT48(fVar166 * fStack_338 * fStack_338,
                                   CONCAT44(fVar165 * (float)local_340._4_4_ *
                                                      (float)local_340._4_4_,
                                            fVar160 * (float)local_340._0_4_ *
                                                      (float)local_340._0_4_))));
  uVar121 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar107._4_4_ = uVar121;
  auVar107._0_4_ = uVar121;
  auVar107._8_4_ = uVar121;
  auVar107._12_4_ = uVar121;
  auVar107._16_4_ = uVar121;
  auVar107._20_4_ = uVar121;
  auVar107._24_4_ = uVar121;
  auVar107._28_4_ = uVar121;
  auVar102 = vcmpps_avx(ZEXT1632(auVar36),auVar65,1);
  auVar102 = vandps_avx(auVar102,auVar132);
  auVar198._8_4_ = 0x7f800000;
  auVar198._0_8_ = 0x7f8000007f800000;
  auVar198._12_4_ = 0x7f800000;
  auVar198._16_4_ = 0x7f800000;
  auVar198._20_4_ = 0x7f800000;
  auVar198._24_4_ = 0x7f800000;
  auVar198._28_4_ = 0x7f800000;
  auVar66._4_4_ = auVar37._4_4_ * -fVar119;
  auVar66._0_4_ = auVar37._0_4_ * -fVar22;
  auVar66._8_4_ = auVar37._8_4_ * -fVar141;
  auVar66._12_4_ = auVar37._12_4_ * -fVar152;
  auVar66._16_4_ = 0x80000000;
  auVar66._20_4_ = 0x80000000;
  auVar66._24_4_ = 0x80000000;
  auVar66._28_4_ = 0x80000000;
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar36 = vpand_avx(auVar83,auVar36);
  auVar102 = vpmovsxwd_avx2(auVar36);
  auVar102 = vblendvps_avx(auVar198,auVar66,auVar102);
  auVar169 = vminps_avx(local_80,auVar102);
  auVar146 = vmaxps_avx(local_80,auVar102);
  auVar94 = vminps_avx(local_500,auVar169);
  auVar100 = vcmpps_avx(auVar94,auVar169,0);
  auVar102 = vcmpps_avx(auVar198,auVar146,0);
  auVar177._8_4_ = 0xff800000;
  auVar177._0_8_ = 0xff800000ff800000;
  auVar177._12_4_ = 0xff800000;
  auVar177._16_4_ = 0xff800000;
  auVar177._20_4_ = 0xff800000;
  auVar177._24_4_ = 0xff800000;
  auVar177._28_4_ = 0xff800000;
  auVar102 = vblendvps_avx(auVar146,auVar177,auVar102);
  auVar146 = vcmpps_avx(auVar198,auVar169,0);
  auVar146 = vblendvps_avx(auVar169,auVar177,auVar146);
  auVar102 = vblendvps_avx(auVar146,auVar102,auVar100);
  _local_340 = vmaxps_avx(local_200,auVar102);
  auVar98._0_4_ = local_560 + auVar94._0_4_;
  auVar98._4_4_ = fStack_55c + auVar94._4_4_;
  auVar98._8_4_ = fStack_558 + auVar94._8_4_;
  auVar98._12_4_ = fStack_554 + auVar94._12_4_;
  auVar98._16_4_ = auVar94._16_4_ + 0.0;
  auVar98._20_4_ = auVar94._20_4_ + 0.0;
  auVar98._24_4_ = auVar94._24_4_ + 0.0;
  auVar98._28_4_ = fStack_544 + auVar94._28_4_;
  fVar22 = (ray->super_RayK<1>).tfar;
  auVar128._4_4_ = fVar22;
  auVar128._0_4_ = fVar22;
  auVar128._8_4_ = fVar22;
  auVar128._12_4_ = fVar22;
  auVar128._16_4_ = fVar22;
  auVar128._20_4_ = fVar22;
  auVar128._24_4_ = fVar22;
  auVar128._28_4_ = fVar22;
  auVar102 = vcmpps_avx(auVar107,auVar98,2);
  auVar146 = vcmpps_avx(auVar98,auVar128,2);
  auVar102 = vandps_avx(auVar102,auVar146);
  auVar146 = vcmpps_avx(auVar198,auVar94,4);
  auVar102 = vandps_avx(auVar102,auVar146);
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  local_360 = vpand_avx(auVar83,auVar36);
  local_420._0_4_ = local_340._0_4_ + local_560;
  local_420._4_4_ = local_340._4_4_ + fStack_55c;
  local_420._8_4_ = local_340._8_4_ + fStack_558;
  local_420._12_4_ = local_340._12_4_ + fStack_554;
  local_420._16_4_ = local_340._16_4_ + 0.0;
  local_420._20_4_ = local_340._20_4_ + 0.0;
  local_420._24_4_ = local_340._24_4_ + 0.0;
  local_420._28_4_ = local_340._28_4_ + fStack_544;
  auVar102 = vcmpps_avx(auVar107,local_420,2);
  auVar146 = vcmpps_avx(local_420,auVar128,2);
  auVar102 = vandps_avx(auVar102,auVar146);
  auVar146 = vcmpps_avx(_local_340,auVar177,4);
  auVar102 = vandps_avx(auVar102,auVar146);
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar36 = vpand_avx(auVar83,auVar36);
  local_4c0._0_16_ = vpor_avx(local_360,auVar36);
  auVar102 = vpmovsxwd_avx2(local_4c0._0_16_);
  if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0x7f,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar102 >> 0xbf,0) == '\0') &&
      (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f]) {
    return;
  }
  _local_380 = auVar36;
  auStack_350 = auVar30._16_16_;
  auVar146 = vpmovzxwd_avx2(local_360);
  local_4c0._16_16_ = auVar132._16_16_;
  auVar108 = vpslld_avx2(auVar146,0x1f);
  auVar146 = vblendvps_avx(_local_340,auVar94,auVar108);
  auVar132 = vrcpps_avx(auVar139);
  auVar100 = vblendvps_avx(_local_400,auVar126,auVar108);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = 0x3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar204._16_4_ = 0x3f800000;
  auVar204._20_4_ = 0x3f800000;
  auVar204._24_4_ = 0x3f800000;
  auVar204._28_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar132,auVar139,auVar204);
  fVar105 = fVar3 * fVar21 * fVar105;
  fVar113 = fVar29 * fVar118 * fVar113;
  fVar115 = fVar5 * fVar120 * fVar115;
  fVar117 = fVar19 * fVar150 * fVar117;
  fVar118 = fVar154 * 0.0 * 0.0;
  fVar119 = fVar156 * 0.0 * 0.0;
  fVar120 = fVar158 * 0.0 * 0.0;
  local_600 = auVar102;
  local_a0 = local_3a0._0_4_ * fVar105;
  fStack_9c = local_3a0._4_4_ * fVar113;
  fVar166 = local_3a0._8_4_;
  fVar167 = local_3a0._12_4_;
  fVar172 = local_3a0._16_4_;
  fVar179 = local_3a0._20_4_;
  fVar180 = local_3a0._24_4_;
  local_c0 = local_3a0._0_4_ * fVar140;
  fStack_bc = local_3a0._4_4_ * fVar149;
  auVar169 = vcmpps_avx(auVar146,local_500,0);
  auVar94 = vcmpps_avx(local_200,auVar146,0);
  auVar169 = vorps_avx(auVar169,auVar94);
  auVar36 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
  auVar37 = vpand_avx(auVar83,auVar36);
  auVar169 = vcmpps_avx(local_80,auVar146,0);
  auVar36 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
  auVar83 = vpand_avx(auVar83,auVar36);
  fVar141 = auVar146._0_4_;
  fVar150 = auVar146._4_4_;
  fVar152 = auVar146._8_4_;
  fVar154 = auVar146._12_4_;
  fVar156 = auVar146._16_4_;
  fVar158 = auVar146._20_4_;
  fVar104 = auVar146._24_4_;
  fStack_98 = fVar166 * fVar115;
  fStack_94 = fVar167 * fVar117;
  fStack_90 = fVar172 * fVar118;
  fStack_8c = fVar179 * fVar119;
  fStack_88 = fVar180 * fVar120;
  fStack_84 = -INFINITY;
  auVar168._0_4_ = local_a0 + fVar129 * (fVar141 * fVar6 + (float)local_540._0_4_);
  auVar168._4_4_ = fStack_9c + fVar134 * (fVar150 * fVar6 + (float)local_540._4_4_);
  auVar168._8_4_ = fVar166 * fVar115 + fVar135 * (fVar152 * fVar6 + fStack_538);
  auVar168._12_4_ = fVar167 * fVar117 + fVar136 * (fVar154 * fVar6 + fStack_534);
  auVar168._16_4_ = fVar172 * fVar118 + (fVar156 * fVar6 + (float)uStack_530) * 0.0;
  auVar168._20_4_ = fVar179 * fVar119 + (fVar158 * fVar6 + uStack_530._4_4_) * 0.0;
  auVar168._24_4_ = fVar180 * fVar120 + (fVar104 * fVar6 + (float)uStack_528) * 0.0;
  auVar168._28_4_ = local_540._28_4_ + 0.0 + -INFINITY;
  fStack_b8 = fVar166 * fVar151;
  fStack_b4 = fVar167 * fVar153;
  fStack_b0 = fVar172 * fVar155;
  fStack_ac = fVar179 * fVar157;
  fStack_a8 = fVar180 * fVar159;
  uStack_a4 = auVar102._28_4_;
  fVar3 = auVar100._0_4_;
  auVar184._0_4_ = local_c0 * fVar3;
  fVar29 = auVar100._4_4_;
  auVar184._4_4_ = fStack_bc * fVar29;
  fVar5 = auVar100._8_4_;
  auVar184._8_4_ = fVar166 * fVar151 * fVar5;
  fVar6 = auVar100._12_4_;
  auVar184._12_4_ = fVar167 * fVar153 * fVar6;
  fVar19 = auVar100._16_4_;
  auVar184._16_4_ = fVar172 * fVar155 * fVar19;
  fVar21 = auVar100._20_4_;
  auVar184._20_4_ = fVar179 * fVar157 * fVar21;
  fVar22 = auVar100._24_4_;
  auVar184._24_4_ = fVar180 * fVar159 * fVar22;
  auVar184._28_4_ = 0;
  auVar169 = vsubps_avx(auVar168,auVar184);
  local_100 = local_3c0._0_4_ * fVar105;
  fStack_fc = local_3c0._4_4_ * fVar113;
  fVar112 = local_3c0._8_4_;
  fVar114 = local_3c0._12_4_;
  fVar116 = local_3c0._16_4_;
  fVar160 = local_3c0._20_4_;
  fVar165 = local_3c0._24_4_;
  fStack_f8 = fVar112 * fVar115;
  fStack_f4 = fVar114 * fVar117;
  fStack_f0 = fVar116 * fVar118;
  fStack_ec = fVar160 * fVar119;
  fStack_e8 = fVar165 * fVar120;
  auVar185._0_4_ = fVar129 * (fVar141 * fVar4 + (float)local_320._0_4_) + local_100;
  auVar185._4_4_ = fVar134 * (fVar150 * fVar4 + (float)local_320._4_4_) + fStack_fc;
  auVar185._8_4_ = fVar135 * (fVar152 * fVar4 + fStack_318) + fVar112 * fVar115;
  auVar185._12_4_ = fVar136 * (fVar154 * fVar4 + fStack_314) + fVar114 * fVar117;
  auVar185._16_4_ = (fVar156 * fVar4 + fStack_310) * 0.0 + fVar116 * fVar118;
  auVar185._20_4_ = (fVar158 * fVar4 + fStack_30c) * 0.0 + fVar160 * fVar119;
  auVar185._24_4_ = (fVar104 * fVar4 + fStack_308) * 0.0 + fVar165 * fVar120;
  auVar185._28_4_ = local_320._28_4_ + 0.0 + fStack_e4;
  local_e0 = local_3c0._0_4_ * fVar140;
  fStack_dc = local_3c0._4_4_ * fVar149;
  fStack_d8 = fVar112 * fVar151;
  fStack_d4 = fVar114 * fVar153;
  fStack_d0 = fVar116 * fVar155;
  fStack_cc = fVar160 * fVar157;
  fStack_c8 = fVar165 * fVar159;
  fStack_c4 = fStack_e4;
  auVar67._4_4_ = fStack_dc * fVar29;
  auVar67._0_4_ = local_e0 * fVar3;
  auVar67._8_4_ = fVar112 * fVar151 * fVar5;
  auVar67._12_4_ = fVar114 * fVar153 * fVar6;
  auVar67._16_4_ = fVar116 * fVar155 * fVar19;
  auVar67._20_4_ = fVar160 * fVar157 * fVar21;
  auVar67._24_4_ = fVar165 * fVar159 * fVar22;
  auVar67._28_4_ = 0xff800000;
  auVar94 = vsubps_avx(auVar185,auVar67);
  auVar139 = vpmovsxwd_avx2(auVar83);
  local_140._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
  local_140._8_4_ = -fVar166;
  local_140._12_4_ = -fVar167;
  local_140._16_4_ = -fVar172;
  local_140._20_4_ = -fVar179;
  local_140._24_4_ = -fVar180;
  local_140._28_4_ = -fVar45;
  auVar100 = vblendvps_avx(local_3a0,local_140,auVar139);
  auVar30 = vpmovsxwd_avx2(auVar37);
  local_1e0 = vblendvps_avx(auVar100,auVar169,auVar30);
  local_160._0_8_ = local_3c0._0_8_ ^ 0x8000000080000000;
  local_160._8_4_ = -fVar112;
  local_160._12_4_ = -fVar114;
  local_160._16_4_ = -fVar116;
  local_160._20_4_ = -fVar160;
  local_160._24_4_ = -fVar165;
  local_160._28_4_ = -fVar46;
  auVar100 = vblendvps_avx(local_3c0,local_160,auVar139);
  local_280 = vblendvps_avx(auVar100,auVar94,auVar30);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar132,auVar132);
  fStack_21c = fVar23 * fVar113;
  local_220 = fVar20 * fVar105;
  fStack_218 = fVar24 * fVar115;
  fStack_214 = fVar25 * fVar117;
  fStack_210 = fVar26 * fVar118;
  fStack_20c = fVar27 * fVar119;
  fStack_208 = fVar28 * fVar120;
  fStack_204 = auVar132._28_4_;
  auVar99._0_4_ = fVar20 * fVar105 + fVar129 * ((float)local_4e0._4_4_ * fVar141 + fVar201);
  auVar99._4_4_ = fVar23 * fVar113 + fVar134 * ((float)local_4e0._4_4_ * fVar150 + fVar206);
  auVar99._8_4_ = fVar24 * fVar115 + fVar135 * ((float)local_4e0._4_4_ * fVar152 + fVar207);
  auVar99._12_4_ = fVar25 * fVar117 + fVar136 * ((float)local_4e0._4_4_ * fVar154 + fVar208);
  auVar99._16_4_ = fVar26 * fVar118 + ((float)local_4e0._4_4_ * fVar156 + fVar209) * 0.0;
  auVar99._20_4_ = fVar27 * fVar119 + ((float)local_4e0._4_4_ * fVar158 + fVar210) * 0.0;
  auVar99._24_4_ = fVar28 * fVar120 + ((float)local_4e0._4_4_ * fVar104 + fVar211) * 0.0;
  auVar99._28_4_ = auVar132._28_4_ + fVar45 + 0.0 + fStack_464;
  local_1c0 = fVar20 * fVar140;
  fStack_1bc = fVar23 * fVar149;
  fStack_1b8 = fVar24 * fVar151;
  fStack_1b4 = fVar25 * fVar153;
  fStack_1b0 = fVar26 * fVar155;
  fStack_1ac = fVar27 * fVar157;
  fStack_1a8 = fVar28 * fVar159;
  uStack_1a4 = auVar108._28_4_;
  auVar68._4_4_ = fVar29 * fVar23 * fVar149;
  auVar68._0_4_ = fVar3 * fVar20 * fVar140;
  auVar68._8_4_ = fVar5 * fVar24 * fVar151;
  auVar68._12_4_ = fVar6 * fVar25 * fVar153;
  auVar68._16_4_ = fVar19 * fVar26 * fVar155;
  auVar68._20_4_ = fVar21 * fVar27 * fVar157;
  auVar68._24_4_ = fVar22 * fVar28 * fVar159;
  auVar68._28_4_ = auVar108._28_4_;
  auVar169 = vsubps_avx(auVar99,auVar68);
  local_180._0_8_ = local_3e0._0_8_ ^ 0x8000000080000000;
  local_180._8_4_ = -fVar24;
  local_180._12_4_ = -fVar25;
  local_180._16_4_ = -fVar26;
  local_180._20_4_ = -fVar27;
  local_180._24_4_ = -fVar28;
  local_180._28_4_ = local_3e0._28_4_ ^ 0x80000000;
  auVar100 = vblendvps_avx(local_3e0,local_180,auVar139);
  local_260 = vblendvps_avx(auVar100,auVar169,auVar30);
  auVar89._8_4_ = 0x3f800000;
  auVar89._0_8_ = 0x3f8000003f800000;
  auVar89._12_4_ = 0x3f800000;
  auVar89._16_4_ = 0x3f800000;
  auVar89._20_4_ = 0x3f800000;
  auVar89._24_4_ = 0x3f800000;
  auVar89._28_4_ = 0x3f800000;
  local_120 = vandnps_avx(auVar139,auVar89);
  _local_4a0 = ZEXT1632(auVar83);
  auVar69._4_4_ = fVar29 * auVar83._4_4_;
  auVar69._0_4_ = fVar3 * auVar83._0_4_;
  auVar69._8_4_ = fVar5 * auVar83._8_4_;
  auVar69._12_4_ = fVar6 * auVar83._12_4_;
  auVar69._16_4_ = fVar19 * 0.0;
  auVar69._20_4_ = fVar21 * 0.0;
  auVar69._24_4_ = fVar22 * 0.0;
  auVar69._28_4_ = auVar100._28_4_;
  local_300 = vblendvps_avx(local_120,auVar69,auVar30);
  local_2c0._0_4_ = fVar141 + local_560;
  local_2c0._4_4_ = fVar150 + fStack_55c;
  local_2c0._8_4_ = fVar152 + fStack_558;
  local_2c0._12_4_ = fVar154 + fStack_554;
  local_2c0._16_4_ = fVar156 + 0.0;
  local_2c0._20_4_ = fVar158 + 0.0;
  local_2c0._24_4_ = fVar104 + 0.0;
  local_2c0._28_4_ = auVar146._28_4_ + fStack_544;
  auVar196 = ZEXT3264(local_2c0);
  auVar146 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
  auVar93 = ZEXT3264(auVar146);
  local_2e0 = ZEXT832(0) << 0x20;
  local_2a0 = local_1e0;
  auVar100 = vpmovzxwd_avx2(local_4c0._0_16_);
  auVar100 = vpslld_avx2(auVar100,0x1f);
  auVar109._8_4_ = 0x7f800000;
  auVar109._0_8_ = 0x7f8000007f800000;
  auVar109._12_4_ = 0x7f800000;
  auVar109._16_4_ = 0x7f800000;
  auVar109._20_4_ = 0x7f800000;
  auVar109._24_4_ = 0x7f800000;
  auVar109._28_4_ = 0x7f800000;
  auVar100 = vblendvps_avx(auVar109,local_2c0,auVar100);
  auVar169 = vshufps_avx(auVar100,auVar100,0xb1);
  auVar169 = vminps_avx(auVar100,auVar169);
  auVar94 = vshufpd_avx(auVar169,auVar169,5);
  auVar169 = vminps_avx(auVar169,auVar94);
  auVar94 = vpermpd_avx2(auVar169,0x4e);
  auVar169 = vminps_avx(auVar169,auVar94);
  auVar100 = vcmpps_avx(auVar100,auVar169,0);
  local_580 = auVar102;
  auVar169 = auVar102 & auVar100;
  auVar186 = ZEXT3264(local_3a0);
  auVar148 = ZEXT3264(local_3c0);
  auVar200 = ZEXT3264(local_3e0);
  auVar164 = ZEXT3264(local_500);
  if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar169 >> 0x7f,0) != '\0') ||
        (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar169 >> 0xbf,0) != '\0') ||
      (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar169[0x1f] < '\0')
  {
    auVar102 = vandps_avx(auVar102,auVar100);
  }
  auVar83 = auVar146._0_16_;
  uVar77 = vextractps_avx(auVar83,1);
  uVar78 = vmovmskps_avx(auVar102);
  uVar79 = 0;
  for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
    uVar79 = uVar79 + 1;
  }
  auVar190 = ZEXT1664(auVar83);
  auVar171 = ZEXT3264(_local_4e0);
  auVar193 = ZEXT3264(_local_540);
  auVar205 = ZEXT3264(local_460);
  auVar178 = ZEXT3264(local_520);
  _local_540 = auVar192;
  _local_480 = auVar199;
  _local_320 = auVar101;
  do {
    auVar102 = _local_340;
    auVar169 = auVar171._0_32_;
    auVar100 = auVar164._0_32_;
    auVar192 = auVar193._0_32_;
    auVar202 = auVar205._0_28_;
    auVar173 = auVar178._0_28_;
    auVar199 = auVar200._0_32_;
    auVar146 = auVar148._0_32_;
    auVar94 = auVar186._0_32_;
    uVar81 = (ulong)uVar79;
    local_598 = local_1a0[uVar81];
    pGVar14 = (pSVar82->geometries).items[local_598].ptr;
    if ((pGVar14->mask & uVar77) == 0) {
      *(undefined4 *)(local_580 + uVar81 * 4) = 0;
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        fVar3 = *(float *)(local_300 + uVar81 * 4);
        fVar29 = *(float *)(local_2e0 + uVar81 * 4);
        local_600._0_4_ = *(float *)(local_2c0 + uVar81 * 4);
        (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar81 * 4);
        (ray->Ng).field_0.field_0.x = *(float *)(local_2a0 + uVar81 * 4);
        (ray->Ng).field_0.field_0.y = *(float *)(local_280 + uVar81 * 4);
        (ray->Ng).field_0.field_0.z = *(float *)(local_260 + uVar81 * 4);
        ray->u = fVar3;
        ray->v = fVar29;
        ray->primID = (line->primIDs).field_0.i[uVar81];
        ray->geomID = local_598;
        ray->instID[0] = context->user->instID[0];
        ray->instPrimID[0] = context->user->instPrimID[0];
        uVar121 = SUB324(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
        uVar77 = (ray->super_RayK<1>).mask;
        goto LAB_013aa3df;
      }
      local_4c0 = auVar196._0_32_;
      local_600._0_4_ = auVar190._0_4_;
      local_560 = SUB84(line,0);
      fStack_55c = (float)((ulong)line >> 0x20);
      local_5b0 = *(float *)(local_2a0 + uVar81 * 4);
      local_5ac = *(undefined4 *)(local_280 + uVar81 * 4);
      local_5a8 = *(undefined4 *)(local_260 + uVar81 * 4);
      local_5a4 = *(undefined4 *)(local_300 + uVar81 * 4);
      local_5a0 = *(undefined4 *)(local_2e0 + uVar81 * 4);
      local_59c = (line->primIDs).field_0.i[uVar81];
      local_594 = context->user->instID[0];
      local_590 = context->user->instPrimID[0];
      (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar81 * 4);
      local_614 = -1;
      local_5e0.valid = &local_614;
      local_5e0.geometryUserPtr = pGVar14->userPtr;
      local_5e0.context = context->user;
      local_5e0.ray = (RTCRayN *)ray;
      local_5e0.hit = (RTCHitN *)&local_5b0;
      local_5e0.N = 1;
      if ((pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
         ((*pGVar14->intersectionFilterN)(&local_5e0), context = local_610, *local_5e0.valid != 0))
      {
        p_Var18 = context->args->filter;
        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
              RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)) &&
            ((*p_Var18)(&local_5e0), context = local_610, *local_5e0.valid == 0))))
        goto LAB_013aa29f;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.x = *(float *)local_5e0.hit;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y = *(float *)(local_5e0.hit + 4)
        ;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z = *(float *)(local_5e0.hit + 8)
        ;
        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
      }
      else {
LAB_013aa29f:
        (ray->super_RayK<1>).tfar = (float)local_600._0_4_;
        context = local_610;
      }
      line = (Primitive *)CONCAT44(fStack_55c,local_560);
      auVar171 = ZEXT3264(_local_4e0);
      auVar205 = ZEXT3264(local_460);
      auVar178 = ZEXT3264(local_520);
      auVar193 = ZEXT3264(_local_540);
      auVar186 = ZEXT3264(local_3a0);
      auVar148 = ZEXT3264(local_3c0);
      auVar200 = ZEXT3264(local_3e0);
      auVar164 = ZEXT3264(local_500);
      *(undefined4 *)(local_580 + uVar81 * 4) = 0;
      fVar3 = (ray->super_RayK<1>).tfar;
      auVar90._4_4_ = fVar3;
      auVar90._0_4_ = fVar3;
      auVar90._8_4_ = fVar3;
      auVar90._12_4_ = fVar3;
      auVar90._16_4_ = fVar3;
      auVar90._20_4_ = fVar3;
      auVar90._24_4_ = fVar3;
      auVar90._28_4_ = fVar3;
      auVar196 = ZEXT3264(local_4c0);
      auVar102 = vcmpps_avx(local_4c0,auVar90,2);
      local_580 = vandps_avx(auVar102,local_580);
      auVar93 = ZEXT3264(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar);
      uVar77 = (ray->super_RayK<1>).mask;
      auVar190 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      pSVar82 = local_608;
      auVar102 = _local_340;
    }
    uVar121 = auVar93._0_4_;
    auVar169 = auVar171._0_32_;
    auVar100 = auVar164._0_32_;
    auVar192 = auVar193._0_32_;
    auVar202 = auVar205._0_28_;
    auVar173 = auVar178._0_28_;
    auVar199 = auVar200._0_32_;
    auVar146 = auVar148._0_32_;
    auVar94 = auVar186._0_32_;
    if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_580 >> 0x7f,0) == '\0') &&
          (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_580 >> 0xbf,0) == '\0') &&
        (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_580[0x1f]) break;
    auVar110._8_4_ = 0x7f800000;
    auVar110._0_8_ = 0x7f8000007f800000;
    auVar110._12_4_ = 0x7f800000;
    auVar110._16_4_ = 0x7f800000;
    auVar110._20_4_ = 0x7f800000;
    auVar110._24_4_ = 0x7f800000;
    auVar110._28_4_ = 0x7f800000;
    auVar102 = vblendvps_avx(auVar110,auVar196._0_32_,local_580);
    auVar146 = vshufps_avx(auVar102,auVar102,0xb1);
    auVar146 = vminps_avx(auVar102,auVar146);
    auVar100 = vshufpd_avx(auVar146,auVar146,5);
    auVar146 = vminps_avx(auVar146,auVar100);
    auVar100 = vpermpd_avx2(auVar146,0x4e);
    auVar146 = vminps_avx(auVar146,auVar100);
    auVar146 = vcmpps_avx(auVar102,auVar146,0);
    auVar100 = local_580 & auVar146;
    auVar102 = local_580;
    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar100 >> 0x7f,0) != '\0') ||
          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar100 >> 0xbf,0) != '\0') ||
        (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar100[0x1f] < '\0') {
      auVar102 = vandps_avx(auVar146,local_580);
    }
    uVar78 = vmovmskps_avx(auVar102);
    uVar79 = 0;
    for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
      uVar79 = uVar79 + 1;
    }
  } while( true );
  local_600._0_4_ = auVar190._0_4_;
LAB_013aa3df:
  auVar36 = vpand_avx(_local_380,local_360);
  auVar91._4_4_ = uVar121;
  auVar91._0_4_ = uVar121;
  auVar91._8_4_ = uVar121;
  auVar91._12_4_ = uVar121;
  auVar91._16_4_ = uVar121;
  auVar91._20_4_ = uVar121;
  auVar91._24_4_ = uVar121;
  auVar91._28_4_ = uVar121;
  auVar93 = ZEXT3264(local_420);
  auVar101 = vcmpps_avx(local_420,auVar91,2);
  auVar83 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
  auVar83 = vpand_avx(auVar83,auVar36);
  auVar101 = vpmovzxwd_avx2(auVar83);
  auVar101 = vpslld_avx2(auVar101,0x1f);
  if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0x7f,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar101 >> 0xbf,0) == '\0') &&
      (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f]) {
    return;
  }
  auVar132 = vcmpps_avx(auVar102,local_80,0);
  auVar94 = vblendvps_avx(auVar94,local_140,auVar132);
  auVar146 = vblendvps_avx(auVar146,local_160,auVar132);
  auVar199 = vblendvps_avx(auVar199,local_180,auVar132);
  auVar132 = vcmpps_avx(auVar102,auVar100,0);
  auVar139 = vcmpps_avx(auVar102,local_200,0);
  auVar132 = vorps_avx(auVar132,auVar139);
  fVar3 = auVar102._0_4_;
  fVar29 = auVar102._4_4_;
  fVar4 = auVar102._8_4_;
  fVar5 = auVar102._12_4_;
  fVar6 = auVar102._16_4_;
  fVar19 = auVar102._20_4_;
  fVar20 = auVar102._24_4_;
  auVar147._0_4_ = (float)local_240._0_4_ * (auVar192._0_4_ + auVar173._0_4_ * fVar3) + local_a0;
  auVar147._4_4_ = (float)local_240._4_4_ * (auVar192._4_4_ + auVar173._4_4_ * fVar29) + fStack_9c;
  auVar147._8_4_ = fStack_238 * (auVar192._8_4_ + auVar173._8_4_ * fVar4) + fStack_98;
  auVar147._12_4_ = fStack_234 * (auVar192._12_4_ + auVar173._12_4_ * fVar5) + fStack_94;
  auVar147._16_4_ = fStack_230 * (auVar192._16_4_ + auVar173._16_4_ * fVar6) + fStack_90;
  auVar147._20_4_ = fStack_22c * (auVar192._20_4_ + auVar173._20_4_ * fVar19) + fStack_8c;
  auVar147._24_4_ = fStack_228 * (auVar192._24_4_ + auVar173._24_4_ * fVar20) + fStack_88;
  auVar147._28_4_ = auVar192._28_4_ + auVar139._28_4_ + fStack_84;
  auVar163._0_4_ =
       (float)local_240._0_4_ * (auVar202._0_4_ * fVar3 + (float)local_320._0_4_) + local_100;
  auVar163._4_4_ =
       (float)local_240._4_4_ * (auVar202._4_4_ * fVar29 + (float)local_320._4_4_) + fStack_fc;
  auVar163._8_4_ = fStack_238 * (auVar202._8_4_ * fVar4 + fStack_318) + fStack_f8;
  auVar163._12_4_ = fStack_234 * (auVar202._12_4_ * fVar5 + fStack_314) + fStack_f4;
  auVar163._16_4_ = fStack_230 * (auVar202._16_4_ * fVar6 + fStack_310) + fStack_f0;
  auVar163._20_4_ = fStack_22c * (auVar202._20_4_ * fVar19 + fStack_30c) + fStack_ec;
  auVar163._24_4_ = fStack_228 * (auVar202._24_4_ * fVar20 + fStack_308) + fStack_e8;
  auVar163._28_4_ = auVar100._28_4_ + fStack_304 + fStack_e4;
  auVar170._0_4_ =
       (float)local_240._0_4_ * (auVar169._0_4_ * fVar3 + (float)local_480._0_4_) + local_220;
  auVar170._4_4_ =
       (float)local_240._4_4_ * (auVar169._4_4_ * fVar29 + (float)local_480._4_4_) + fStack_21c;
  auVar170._8_4_ = fStack_238 * (auVar169._8_4_ * fVar4 + fStack_478) + fStack_218;
  auVar170._12_4_ = fStack_234 * (auVar169._12_4_ * fVar5 + fStack_474) + fStack_214;
  auVar170._16_4_ = fStack_230 * (auVar169._16_4_ * fVar6 + fStack_470) + fStack_210;
  auVar170._20_4_ = fStack_22c * (auVar169._20_4_ * fVar19 + fStack_46c) + fStack_20c;
  auVar170._24_4_ = fStack_228 * (auVar169._24_4_ * fVar20 + fStack_468) + fStack_208;
  auVar170._28_4_ = auVar169._28_4_ + fStack_464 + fStack_204;
  auVar70._4_4_ = (float)local_400._4_4_ * fStack_bc;
  auVar70._0_4_ = (float)local_400._0_4_ * local_c0;
  auVar70._8_4_ = fStack_3f8 * fStack_b8;
  auVar70._12_4_ = fStack_3f4 * fStack_b4;
  auVar70._16_4_ = fStack_3f0 * fStack_b0;
  auVar70._20_4_ = fStack_3ec * fStack_ac;
  auVar70._24_4_ = fStack_3e8 * fStack_a8;
  auVar70._28_4_ = uStack_224;
  auVar102 = vsubps_avx(auVar147,auVar70);
  auVar71._4_4_ = (float)local_400._4_4_ * fStack_dc;
  auVar71._0_4_ = (float)local_400._0_4_ * local_e0;
  auVar71._8_4_ = fStack_3f8 * fStack_d8;
  auVar71._12_4_ = fStack_3f4 * fStack_d4;
  auVar71._16_4_ = fStack_3f0 * fStack_d0;
  auVar71._20_4_ = fStack_3ec * fStack_cc;
  auVar71._24_4_ = fStack_3e8 * fStack_c8;
  auVar71._28_4_ = uStack_224;
  auVar100 = vsubps_avx(auVar163,auVar71);
  auVar72._4_4_ = (float)local_400._4_4_ * fStack_1bc;
  auVar72._0_4_ = (float)local_400._0_4_ * local_1c0;
  auVar72._8_4_ = fStack_3f8 * fStack_1b8;
  auVar72._12_4_ = fStack_3f4 * fStack_1b4;
  auVar72._16_4_ = fStack_3f0 * fStack_1b0;
  auVar72._20_4_ = fStack_3ec * fStack_1ac;
  auVar72._24_4_ = fStack_3e8 * fStack_1a8;
  auVar72._28_4_ = uStack_224;
  auVar169 = vsubps_avx(auVar170,auVar72);
  local_2a0 = vblendvps_avx(auVar94,auVar102,auVar132);
  local_280 = vblendvps_avx(auVar146,auVar100,auVar132);
  local_260 = vblendvps_avx(auVar199,auVar169,auVar132);
  auVar73._4_4_ = (float)local_400._4_4_ * (float)local_4a0._4_4_;
  auVar73._0_4_ = (float)local_400._0_4_ * (float)local_4a0._0_4_;
  auVar73._8_4_ = fStack_3f8 * fStack_498;
  auVar73._12_4_ = fStack_3f4 * fStack_494;
  auVar73._16_4_ = fStack_3f0 * fStack_490;
  auVar73._20_4_ = fStack_3ec * fStack_48c;
  auVar73._24_4_ = fStack_3e8 * fStack_488;
  auVar73._28_4_ = auVar102._28_4_;
  local_300 = vblendvps_avx(local_120,auVar73,auVar132);
  local_2e0 = ZEXT832(0) << 0x20;
  local_2c0 = local_420;
  auVar111._8_4_ = 0x7f800000;
  auVar111._0_8_ = 0x7f8000007f800000;
  auVar111._12_4_ = 0x7f800000;
  auVar111._16_4_ = 0x7f800000;
  auVar111._20_4_ = 0x7f800000;
  auVar111._24_4_ = 0x7f800000;
  auVar111._28_4_ = 0x7f800000;
  auVar102 = vblendvps_avx(auVar111,local_420,auVar101);
  auVar146 = vshufps_avx(auVar102,auVar102,0xb1);
  auVar146 = vminps_avx(auVar102,auVar146);
  auVar100 = vshufpd_avx(auVar146,auVar146,5);
  auVar146 = vminps_avx(auVar146,auVar100);
  auVar100 = vpermpd_avx2(auVar146,0x4e);
  auVar146 = vminps_avx(auVar146,auVar100);
  auVar102 = vcmpps_avx(auVar102,auVar146,0);
  auVar36 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
  auVar83 = vpand_avx(auVar36,auVar83);
  local_580 = vpsrad_avx2(auVar101,0x1f);
  pSVar82 = context->scene;
  auVar102 = vpmovzxwd_avx2(auVar83);
  auVar102 = vpslld_avx2(auVar102,0x1f);
  if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0x7f,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar102 >> 0xbf,0) == '\0') &&
      (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f]) {
    auVar102 = local_580;
  }
  uVar78 = vmovmskps_avx(auVar102);
  uVar79 = 0;
  for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
    uVar79 = uVar79 + 1;
  }
  do {
    uVar81 = (ulong)uVar79;
    local_598 = local_1a0[uVar81];
    pGVar14 = (pSVar82->geometries).items[local_598].ptr;
    if ((pGVar14->mask & uVar77) == 0) {
      *(undefined4 *)(local_580 + uVar81 * 4) = 0;
    }
    else {
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
        fVar3 = *(float *)(local_300 + uVar81 * 4);
        fVar29 = *(float *)(local_2e0 + uVar81 * 4);
        (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar81 * 4);
        (ray->Ng).field_0.field_0.x = *(float *)(local_2a0 + uVar81 * 4);
        (ray->Ng).field_0.field_0.y = *(float *)(local_280 + uVar81 * 4);
        (ray->Ng).field_0.field_0.z = *(float *)(local_260 + uVar81 * 4);
        ray->u = fVar3;
        ray->v = fVar29;
        ray->primID = (line->primIDs).field_0.i[uVar81];
        ray->geomID = local_598;
        ray->instID[0] = context->user->instID[0];
        ray->instPrimID[0] = context->user->instPrimID[0];
        return;
      }
      local_560 = SUB84(line,0);
      fStack_55c = (float)((ulong)line >> 0x20);
      local_5b0 = *(float *)(local_2a0 + uVar81 * 4);
      local_5ac = *(undefined4 *)(local_280 + uVar81 * 4);
      local_5a8 = *(undefined4 *)(local_260 + uVar81 * 4);
      local_5a4 = *(undefined4 *)(local_300 + uVar81 * 4);
      local_5a0 = *(undefined4 *)(local_2e0 + uVar81 * 4);
      local_59c = (line->primIDs).field_0.i[uVar81];
      local_594 = context->user->instID[0];
      local_590 = context->user->instPrimID[0];
      (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar81 * 4);
      local_614 = -1;
      local_5e0.valid = &local_614;
      local_5e0.geometryUserPtr = pGVar14->userPtr;
      local_5e0.context = context->user;
      local_5e0.ray = (RTCRayN *)ray;
      local_5e0.hit = (RTCHitN *)&local_5b0;
      local_5e0.N = 1;
      if ((pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
         ((*pGVar14->intersectionFilterN)(&local_5e0), context = local_610, *local_5e0.valid != 0))
      {
        p_Var18 = context->args->filter;
        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
              RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)) &&
            ((*p_Var18)(&local_5e0), context = local_610, *local_5e0.valid == 0))))
        goto LAB_013aa7c1;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.x = *(float *)local_5e0.hit;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y = *(float *)(local_5e0.hit + 4)
        ;
        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z = *(float *)(local_5e0.hit + 8)
        ;
        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
      }
      else {
LAB_013aa7c1:
        (ray->super_RayK<1>).tfar = (float)local_600._0_4_;
        context = local_610;
      }
      line = (Primitive *)CONCAT44(fStack_55c,local_560);
      *(undefined4 *)(local_580 + uVar81 * 4) = 0;
      fVar3 = (ray->super_RayK<1>).tfar;
      auVar92._4_4_ = fVar3;
      auVar92._0_4_ = fVar3;
      auVar92._8_4_ = fVar3;
      auVar92._12_4_ = fVar3;
      auVar92._16_4_ = fVar3;
      auVar92._20_4_ = fVar3;
      auVar92._24_4_ = fVar3;
      auVar92._28_4_ = fVar3;
      auVar93 = ZEXT3264(local_420);
      auVar102 = vcmpps_avx(local_420,auVar92,2);
      local_580 = vandps_avx(auVar102,local_580);
      uVar77 = (ray->super_RayK<1>).mask;
      local_600._0_4_ = (ray->super_RayK<1>).tfar;
    }
    if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_580 >> 0x7f,0) == '\0') &&
          (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_580 >> 0xbf,0) == '\0') &&
        (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_580[0x1f]) {
      return;
    }
    auVar103._8_4_ = 0x7f800000;
    auVar103._0_8_ = 0x7f8000007f800000;
    auVar103._12_4_ = 0x7f800000;
    auVar103._16_4_ = 0x7f800000;
    auVar103._20_4_ = 0x7f800000;
    auVar103._24_4_ = 0x7f800000;
    auVar103._28_4_ = 0x7f800000;
    auVar102 = vblendvps_avx(auVar103,auVar93._0_32_,local_580);
    auVar146 = vshufps_avx(auVar102,auVar102,0xb1);
    auVar146 = vminps_avx(auVar102,auVar146);
    auVar100 = vshufpd_avx(auVar146,auVar146,5);
    auVar146 = vminps_avx(auVar146,auVar100);
    auVar100 = vpermpd_avx2(auVar146,0x4e);
    auVar146 = vminps_avx(auVar146,auVar100);
    auVar146 = vcmpps_avx(auVar102,auVar146,0);
    auVar100 = local_580 & auVar146;
    auVar102 = local_580;
    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar100 >> 0x7f,0) != '\0') ||
          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar100 >> 0xbf,0) != '\0') ||
        (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar100[0x1f] < '\0') {
      auVar102 = vandps_avx(auVar146,local_580);
    }
    uVar78 = vmovmskps_avx(auVar102);
    uVar79 = 0;
    for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
      uVar79 = uVar79 + 1;
    }
  } while( true );
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time());
        const vbool<M> valid = line.valid();
        ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Intersect1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }